

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeights
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  LineInterpolationRange *returnValue;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Vec2 VVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vec2 VVar15;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float res_2;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  uint uVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  float sqSum;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  LineInterpolationRange LVar40;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar6 = 0;
  do {
    res.m_data[lVar6] = pr->m_data[lVar6] - pa->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar6 = 0;
  do {
    res_1.m_data[lVar6] = pb->m_data[lVar6] - pa->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  fVar21 = 0.0;
  lVar6 = 0;
  do {
    fVar21 = fVar21 + res.m_data[lVar6] * res_1.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  fVar24 = fVar21;
  if (ABS(fVar21) != INFINITY) {
    fVar7 = (float)((uint)fVar21 & 0x7f800000);
    fVar24 = 1.1754944e-38;
    if (((uint)fVar21 & 0x7fffff) == 0) {
      fVar24 = fVar7;
    }
    if (fVar7 != 0.0) {
      fVar24 = fVar7;
    }
    fVar24 = ((float)((int)fVar24 + 0x2000) - fVar24) + fVar21;
  }
  if (ABS(fVar21) != INFINITY) {
    fVar5 = (float)((uint)fVar21 & 0x7f800000);
    fVar7 = 1.1754944e-38;
    if (((uint)fVar21 & 0x7fffff) == 0) {
      fVar7 = fVar5;
    }
    if (fVar5 != 0.0) {
      fVar7 = fVar5;
    }
    fVar21 = fVar21 - ((float)((int)fVar7 + 0x2000) - fVar7);
  }
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar6 = 0;
  do {
    res.m_data[lVar6] = pb->m_data[lVar6] - pa->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  fVar7 = 0.0;
  lVar6 = 0;
  do {
    fVar7 = fVar7 + res.m_data[lVar6] * res.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  fVar5 = fVar7;
  if (ABS(fVar7) != INFINITY) {
    fVar4 = (float)((uint)fVar7 & 0x7f800000);
    fVar5 = 1.1754944e-38;
    if (((uint)fVar7 & 0x7fffff) == 0) {
      fVar5 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar5 = fVar4;
    }
    fVar5 = ((float)((int)fVar5 + 0x2000) - fVar5) + fVar7;
  }
  if (ABS(fVar7) != INFINITY) {
    fVar1 = (float)((uint)fVar7 & 0x7f800000);
    fVar4 = 1.1754944e-38;
    if (((uint)fVar7 & 0x7fffff) == 0) {
      fVar4 = fVar1;
    }
    if (fVar1 != 0.0) {
      fVar4 = fVar1;
    }
    fVar7 = fVar7 + (fVar4 - (float)((int)fVar4 + 0x2000));
  }
  auVar29._0_12_ = ZEXT812(0);
  auVar29._12_4_ = 0;
  if (fVar24 != 0.0 || fVar21 != 0.0) {
    if ((fVar5 < 0.0) || (0.0 < fVar7)) {
      uVar9 = -(uint)(fVar21 / fVar5 <= fVar21 / fVar7);
      fVar4 = (float)(~uVar9 & (uint)(fVar21 / fVar5) | (uint)(fVar21 / fVar7) & uVar9);
      uVar9 = -(uint)(fVar24 / fVar5 <= fVar24 / fVar7);
      fVar1 = (float)(~uVar9 & (uint)(fVar24 / fVar5) | (uint)(fVar24 / fVar7) & uVar9);
      uVar9 = -(uint)(fVar1 <= fVar4);
      auVar29 = ZEXT416(~uVar9 & (uint)fVar1 | uVar9 & (uint)fVar4);
    }
    else {
      auVar29._0_12_ = ZEXT812(0x7f800000);
      auVar29._12_4_ = 0;
    }
  }
  fVar4 = auVar29._0_4_;
  if (ABS(fVar4) != INFINITY) {
    fVar1 = 1.1754944e-38;
    if ((auVar29 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar4 & 0x7f800000);
    }
    if ((auVar29 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar4 & 0x7f800000);
    }
    auVar29._0_4_ = fVar4 + ((float)((int)fVar1 + 0x6000) - fVar1);
  }
  auVar33 = ZEXT816(0);
  if (fVar24 != 0.0 || fVar21 != 0.0) {
    if ((fVar5 < 0.0) || (0.0 < fVar7)) {
      uVar9 = -(uint)(fVar21 / fVar7 <= fVar21 / fVar5);
      fVar4 = (float)(~uVar9 & (uint)(fVar21 / fVar5) | (uint)(fVar21 / fVar7) & uVar9);
      uVar9 = -(uint)(fVar24 / fVar7 <= fVar24 / fVar5);
      fVar21 = (float)(~uVar9 & (uint)(fVar24 / fVar5) | (uint)(fVar24 / fVar7) & uVar9);
      uVar9 = -(uint)(fVar4 <= fVar21);
      auVar33 = ZEXT416(~uVar9 & (uint)fVar21 | uVar9 & (uint)fVar4);
    }
    else {
      auVar33._0_12_ = ZEXT812(0xff800000);
      auVar33._12_4_ = 0;
    }
  }
  fVar21 = auVar33._0_4_;
  if (ABS(fVar21) != INFINITY) {
    fVar24 = 1.1754944e-38;
    if ((auVar33 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    if ((auVar33 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    auVar33._0_4_ = fVar21 - ((float)((int)fVar24 + 0x6000) - fVar24);
  }
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  fVar24 = auVar33._0_4_;
  uVar9 = auVar33._8_4_;
  uVar28 = auVar33._12_4_;
  fVar21 = auVar29._0_4_;
  if (fVar21 != 0.0 || fVar24 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      uVar8 = -(uint)(fVar21 / wb <= fVar24 / wb);
      auVar25._0_4_ = (uint)(fVar24 / wb) & uVar8;
      auVar25._4_4_ = 0;
      auVar25._8_4_ = uVar9 & auVar29._8_4_;
      auVar25._12_4_ = uVar28 & auVar29._12_4_;
      auVar22 = ZEXT416(~uVar8 & (uint)(fVar21 / wb)) | auVar25;
    }
    else {
      auVar22._0_12_ = ZEXT812(0x7f800000);
      auVar22._12_4_ = 0;
    }
  }
  fVar7 = auVar22._0_4_;
  if (ABS(fVar7) != INFINITY) {
    fVar5 = 1.1754944e-38;
    if ((auVar22 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    if ((auVar22 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    auVar22._0_4_ = fVar7 + ((float)((int)fVar5 + 0x6000) - fVar5);
  }
  auVar27 = ZEXT816(0);
  if (fVar21 != 0.0 || fVar24 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      uVar8 = -(uint)(fVar24 / wb <= fVar21 / wb);
      auVar30._0_4_ = (uint)(fVar24 / wb) & uVar8;
      auVar30._4_4_ = 0;
      auVar30._8_4_ = uVar9;
      auVar30._12_4_ = uVar28;
      auVar26._0_4_ = ~uVar8 & (uint)(fVar21 / wb);
      auVar26._4_4_ = 0;
      auVar26._8_4_ = ~uVar9 & auVar29._8_4_;
      auVar26._12_4_ = ~uVar28 & auVar29._12_4_;
      auVar27 = auVar26 | auVar30;
    }
    else {
      auVar27._0_12_ = ZEXT812(0xff800000);
      auVar27._12_4_ = 0;
    }
  }
  fVar7 = auVar27._0_4_;
  if (ABS(fVar7) != INFINITY) {
    fVar5 = 1.1754944e-38;
    if ((auVar27 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    if ((auVar27 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    auVar27._0_4_ = fVar7 - ((float)((int)fVar5 + 0x6000) - fVar5);
  }
  fVar21 = 1.0 - fVar21;
  fVar24 = 1.0 - fVar24;
  auVar16._0_12_ = ZEXT812(0);
  auVar16._12_4_ = 0;
  if (fVar21 != 0.0 || fVar24 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      uVar9 = -(uint)(fVar24 / wa <= fVar21 / wa);
      auVar16 = ZEXT416(~uVar9 & (uint)(fVar24 / wa) | (uint)(fVar21 / wa) & uVar9);
    }
    else {
      auVar16._0_12_ = ZEXT812(0x7f800000);
      auVar16._12_4_ = 0;
    }
  }
  fVar7 = auVar16._0_4_;
  if (ABS(fVar7) != INFINITY) {
    fVar5 = 1.1754944e-38;
    if ((auVar16 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    if ((auVar16 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar5 = (float)((uint)fVar7 & 0x7f800000);
    }
    auVar16._0_4_ = fVar7 + ((float)((int)fVar5 + 0x6000) - fVar5);
  }
  auVar31 = ZEXT816(0);
  if (fVar21 != 0.0 || fVar24 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      uVar9 = -(uint)(fVar21 / wa <= fVar24 / wa);
      auVar31 = ZEXT416(~uVar9 & (uint)(fVar24 / wa) | (uint)(fVar21 / wa) & uVar9);
    }
    else {
      auVar31._0_12_ = ZEXT812(0xff800000);
      auVar31._12_4_ = 0;
    }
  }
  fVar21 = auVar31._0_4_;
  if (ABS(fVar21) != INFINITY) {
    fVar24 = 1.1754944e-38;
    if ((auVar31 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    if ((auVar31 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    auVar31._0_4_ = fVar21 - ((float)((int)fVar24 + 0x6000) - fVar24);
  }
  fVar7 = auVar22._0_4_;
  auVar13._4_12_ = auVar22._4_12_;
  fVar24 = auVar16._0_4_;
  fVar21 = fVar7 + fVar24;
  if (ABS(fVar21) != INFINITY) {
    fVar4 = (float)((uint)fVar21 & 0x7f800000);
    fVar5 = 1.1754944e-38;
    if (((uint)fVar21 & 0x7fffff) == 0) {
      fVar5 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar5 = fVar4;
    }
    fVar21 = fVar21 + ((float)((int)fVar5 + 0x2000) - fVar5);
  }
  auVar13._0_4_ = fVar21;
  VVar12.m_data = auVar13._0_8_;
  fVar5 = auVar27._0_4_;
  uVar9 = auVar27._4_4_;
  uVar28 = auVar27._8_4_;
  uVar8 = auVar27._12_4_;
  fVar1 = auVar31._0_4_;
  fVar4 = fVar5 + fVar1;
  if (ABS(fVar4) != INFINITY) {
    fVar2 = (float)((uint)fVar4 & 0x7f800000);
    fVar3 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar3 = fVar2;
    }
    if (fVar2 != 0.0) {
      fVar3 = fVar2;
    }
    fVar4 = fVar4 - ((float)((int)fVar3 + 0x2000) - fVar3);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  auVar34._0_12_ = ZEXT812(0);
  auVar34._12_4_ = 0;
  uVar11 = auVar31._8_4_;
  uVar32 = auVar31._12_4_;
  if (fVar24 != 0.0 || fVar1 != 0.0) {
    if ((fVar21 < 0.0) || (0.0 < fVar4)) {
      uVar10 = -(uint)(fVar1 / fVar21 <= fVar1 / fVar4);
      fVar3 = (float)(~uVar10 & (uint)(fVar1 / fVar21) | (uint)(fVar1 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar24 / fVar21 <= fVar24 / fVar4);
      fVar2 = (float)(~uVar10 & (uint)(fVar24 / fVar21) | (uint)(fVar24 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar2 <= fVar3);
      auVar38._0_4_ = uVar10 & (uint)fVar3;
      auVar38._4_4_ = 0;
      auVar38._8_4_ = auVar16._8_4_ & uVar11;
      auVar38._12_4_ = auVar16._12_4_ & uVar32;
      auVar34 = ZEXT416(~uVar10 & (uint)fVar2) | auVar38;
    }
    else {
      auVar34._0_12_ = ZEXT812(0x7f800000);
      auVar34._12_4_ = 0;
    }
  }
  fVar3 = auVar34._0_4_;
  if (ABS(fVar3) != INFINITY) {
    fVar2 = 1.1754944e-38;
    if ((auVar34 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar2 = (float)((uint)fVar3 & 0x7f800000);
    }
    if ((auVar34 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar2 = (float)((uint)fVar3 & 0x7f800000);
    }
    auVar34._0_4_ = fVar3 + ((float)((int)fVar2 + 0x6000) - fVar2);
  }
  *(int *)this = auVar34._0_4_;
  auVar35._0_12_ = ZEXT812(0);
  auVar35._12_4_ = 0;
  if (fVar7 != 0.0 || fVar5 != 0.0) {
    if ((fVar21 < 0.0) || (0.0 < fVar4)) {
      uVar10 = -(uint)(fVar5 / fVar21 <= fVar5 / fVar4);
      fVar3 = (float)(~uVar10 & (uint)(fVar5 / fVar21) | (uint)(fVar5 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar7 / fVar21 <= fVar7 / fVar4);
      fVar2 = (float)(~uVar10 & (uint)(fVar7 / fVar21) | (uint)(fVar7 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar2 <= fVar3);
      auVar39._0_4_ = uVar10 & (uint)fVar3;
      auVar39._4_4_ = auVar22._4_4_ & uVar9;
      auVar39._8_4_ = auVar22._8_4_ & uVar28;
      auVar39._12_4_ = auVar22._12_4_ & uVar8;
      auVar35 = ZEXT416(~uVar10 & (uint)fVar2) | auVar39;
    }
    else {
      auVar35._0_12_ = ZEXT812(0x7f800000);
      auVar35._12_4_ = 0;
    }
  }
  fVar3 = auVar35._0_4_;
  if (ABS(fVar3) != INFINITY) {
    fVar2 = 1.1754944e-38;
    if ((auVar35 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar2 = (float)((uint)fVar3 & 0x7f800000);
    }
    if ((auVar35 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar2 = (float)((uint)fVar3 & 0x7f800000);
    }
    auVar35._0_4_ = fVar3 + ((float)((int)fVar2 + 0x6000) - fVar2);
  }
  *(int *)(this + 4) = auVar35._0_4_;
  auVar37 = ZEXT816(0);
  if (fVar24 != 0.0 || fVar1 != 0.0) {
    if ((fVar21 < 0.0) || (0.0 < fVar4)) {
      uVar10 = -(uint)(fVar1 / fVar4 <= fVar1 / fVar21);
      fVar1 = (float)(~uVar10 & (uint)(fVar1 / fVar21) | (uint)(fVar1 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar24 / fVar4 <= fVar24 / fVar21);
      fVar24 = (float)(~uVar10 & (uint)(fVar24 / fVar21) | (uint)(fVar24 / fVar4) & uVar10);
      uVar10 = -(uint)(fVar1 <= fVar24);
      auVar17._0_4_ = uVar10 & (uint)fVar1;
      auVar17._4_4_ = 0;
      auVar17._8_4_ = uVar11;
      auVar17._12_4_ = uVar32;
      auVar36._0_4_ = ~uVar10 & (uint)fVar24;
      auVar36._4_4_ = 0;
      auVar36._8_4_ = ~uVar11 & auVar16._8_4_;
      auVar36._12_4_ = ~uVar32 & auVar16._12_4_;
      auVar37 = auVar36 | auVar17;
    }
    else {
      auVar37._0_12_ = ZEXT812(0xff800000);
      auVar37._12_4_ = 0;
    }
  }
  fVar24 = auVar37._0_4_;
  if (ABS(fVar24) != INFINITY) {
    fVar1 = 1.1754944e-38;
    if ((auVar37 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar24 & 0x7f800000);
    }
    if ((auVar37 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar24 & 0x7f800000);
    }
    auVar37._0_4_ = fVar24 - ((float)((int)fVar1 + 0x6000) - fVar1);
  }
  *(int *)(this + 8) = auVar37._0_4_;
  auVar19 = ZEXT816(0);
  if (fVar7 != 0.0 || fVar5 != 0.0) {
    if ((fVar21 < 0.0) || (0.0 < fVar4)) {
      uVar11 = -(uint)(fVar5 / fVar4 <= fVar5 / fVar21);
      fVar24 = (float)(~uVar11 & (uint)(fVar5 / fVar21) | (uint)(fVar5 / fVar4) & uVar11);
      uVar11 = -(uint)(fVar7 / fVar4 <= fVar7 / fVar21);
      auVar14._0_4_ = (uint)(fVar7 / fVar4) & uVar11;
      auVar14._4_4_ = auVar22._4_4_;
      auVar14._8_4_ = auVar22._8_4_;
      auVar14._12_4_ = auVar22._12_4_;
      auVar14 = ZEXT416(~uVar11 & (uint)(fVar7 / fVar21)) | auVar14;
      VVar12.m_data = auVar14._0_8_;
      uVar11 = -(uint)(fVar24 <= auVar14._0_4_);
      auVar23._0_4_ = uVar11 & (uint)fVar24;
      auVar23._4_4_ = uVar9;
      auVar23._8_4_ = uVar28;
      auVar23._12_4_ = uVar8;
      auVar18._0_4_ = ~uVar11 & (uint)auVar14._0_4_;
      auVar18._4_4_ = ~uVar9 & auVar14._4_4_;
      auVar18._8_4_ = ~uVar28 & auVar14._8_4_;
      auVar18._12_4_ = ~uVar8 & auVar14._12_4_;
      auVar19 = auVar18 | auVar23;
    }
    else {
      auVar19._0_12_ = ZEXT812(0xff800000);
      auVar19._12_4_ = 0;
    }
  }
  VVar15.m_data = auVar19._0_8_;
  fVar21 = auVar19._0_4_;
  if (ABS(fVar21) != INFINITY) {
    fVar24 = 1.1754944e-38;
    if ((auVar19 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    if ((auVar19 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar24 = (float)((uint)fVar21 & 0x7f800000);
    }
    VVar12.m_data[0] = (float)((int)fVar24 + 0x6000) - fVar24;
    VVar12.m_data[1] = 0.0;
    auVar20._4_12_ = auVar19._4_12_;
    auVar20._0_4_ = fVar21 - VVar12.m_data[0];
    VVar15.m_data = auVar20._0_8_;
  }
  *(float *)(this + 0xc) = VVar15.m_data[0];
  LVar40.min.m_data[0] = VVar15.m_data[0];
  LVar40.min.m_data[1] = VVar15.m_data[1];
  LVar40.max.m_data[0] = VVar12.m_data[0];
  LVar40.max.m_data[1] = VVar12.m_data[1];
  return LVar40;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeights (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int roundError	= 1;
	const int divError		= 3;

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Allow 1 ULP
	const float		dividend	= tcu::dot(pr - pa, pb - pa);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Assuming lengthSquared will not be implemented as sqrt(x)^2, allow 1 ULP
	const float		divisor		= tcu::lengthSquared(pb - pa);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}